

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O3

void ODDLParser::logInvalidTokenError(char *in,string *exp,logCallback callback)

{
  ostream *poVar1;
  size_t sVar2;
  string full;
  string part;
  stringstream stream;
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  char *local_1f0;
  long local_1e8;
  char local_1e0 [16];
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Invalid token \"",0xf);
  local_210[0] = (undefined1 *)CONCAT71(local_210[0]._1_7_,*in);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(local_1a0,(char *)local_210,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," expected \"",0xb);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(exp->_M_dataplus)._M_p,exp->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  local_210[0] = local_200;
  sVar2 = strlen(in);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,in,in + sVar2);
  std::__cxx11::string::substr((ulong)&local_1f0,(ulong)local_210);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,local_1f0,local_1e8);
  std::__cxx11::stringbuf::str();
  (*callback)(ddl_error_msg,&local_1d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0);
  }
  if (local_210[0] != local_200) {
    operator_delete(local_210[0]);
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

static void logInvalidTokenError( char *in, const std::string &exp, OpenDDLParser::logCallback callback ) {
    std::stringstream stream;
    stream << "Invalid token \"" << *in << "\"" << " expected \"" << exp << "\"" << std::endl;
    std::string full( in );
    std::string part( full.substr( 0, 50 ) );
    stream << part;
    callback( ddl_error_msg, stream.str() );
}